

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_tests.cc
# Opt level: O3

void __thiscall
lf::fe::test::lf_fe_ScalarLoadEdgeVectorProvider_complex_Test::
~lf_fe_ScalarLoadEdgeVectorProvider_complex_Test
          (lf_fe_ScalarLoadEdgeVectorProvider_complex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_fe, ScalarLoadEdgeVectorProvider_complex) {
  auto mesh = mesh::test_utils::GenerateHybrid2DTestMesh(5);

  auto g = mesh::utils::MeshFunctionConstant(std::complex<double>{1, 2});
  auto fes = test_utils::MakeComplexLagrangeO1FeSpace(mesh);
  auto selector = [&](const mesh::Entity &e) {
    LF_ASSERT_MSG(e.Codim() == 1, "This is not an edge.");
    return mesh->Index(e) < 7;
  };
  ScalarLoadEdgeVectorProvider evp(fes, g, selector);
  auto evaluator = [&](const Eigen::VectorXcd &test_coeff) {
    auto mf_test = MeshFunctionFE(fes, test_coeff);
    return IntegrateMeshFunction(*mesh, conjugate(mf_test) * g, 2, selector, 1);
  };
  CheckEntityVectorProvider(*fes, evp, evaluator, 1);
}